

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::ChaiScript_Basic::eval_file
          (ChaiScript_Basic *this,string *t_filename,Exception_Handler *t_handler)

{
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  string local_48;
  string *local_28;
  Exception_Handler *t_handler_local;
  string *t_filename_local;
  ChaiScript_Basic *this_local;
  
  local_28 = in_RCX;
  t_handler_local = t_handler;
  t_filename_local = t_filename;
  this_local = this;
  load_file(&local_48,(string *)t_handler);
  eval(this,t_filename,(Exception_Handler *)&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_file(const std::string &t_filename, const Exception_Handler &t_handler = Exception_Handler()) {
      return eval(load_file(t_filename), t_handler, t_filename);
    }